

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O1

double GetUDMFFloat(int type,int index,char *key)

{
  int iVar1;
  FUDMFKey *pFVar2;
  Node *pNVar3;
  int iVar4;
  ulong uVar5;
  FUDMFKey *pFVar6;
  Node *pNVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  
  if (3 < (uint)type) {
    __assert_fail("type >=0 && type <=3",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_udmf.cpp"
                  ,0x166,"double GetUDMFFloat(int, int, const char *)");
  }
  uVar5 = (ulong)(uint)type;
  pFVar6 = (FUDMFKey *)(uVar5 * 3);
  pNVar3 = UDMFKeys[uVar5].Nodes + (UDMFKeys[uVar5].Size - 1 & index);
  do {
    pNVar7 = pNVar3;
    if ((pNVar7 == (Node *)0x0) || (pNVar7->Next == (Node *)0x1)) {
      pNVar7 = (Node *)0x0;
      break;
    }
    pNVar3 = pNVar7->Next;
  } while ((pNVar7->Pair).Key != index);
  if (pNVar7 != (Node *)0x0) {
    iVar4 = FName::NameManager::FindName(&FName::NameData,key,false);
    iVar8 = (pNVar7->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Count - 1;
    pFVar2 = (pNVar7->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Array;
    iVar10 = 0;
    do {
      if (iVar8 < iVar10) {
        pFVar6 = (FUDMFKey *)0x0;
        break;
      }
      uVar9 = (uint)(iVar8 + iVar10) >> 1;
      iVar1 = pFVar2[uVar9].Key.Index;
      if (iVar1 == iVar4) {
        pFVar6 = pFVar2 + uVar9;
      }
      else if (iVar4 < iVar1) {
        iVar8 = uVar9 - 1;
      }
      else {
        iVar10 = uVar9 + 1;
      }
    } while (iVar1 != iVar4);
    if (pFVar6 != (FUDMFKey *)0x0) {
      return pFVar6->FloatVal;
    }
  }
  return 0.0;
}

Assistant:

double GetUDMFFloat(int type, int index, const char *key)
{
	assert(type >=0 && type <=3);

	FUDMFKeys *pKeys = UDMFKeys[type].CheckKey(index);

	if (pKeys != NULL)
	{
		FUDMFKey *pKey = pKeys->Find(key);
		if (pKey != NULL)
		{
			return pKey->FloatVal;
		}
	}
	return 0;
}